

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

vector<float,_std::allocator<float>_> *
readFromSep<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,char *cdata,
                  char sep)

{
  char cVar1;
  iterator __position;
  double dVar2;
  char *__nptr;
  ulong uVar3;
  float local_2c;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*cdata != '\0') {
    uVar3 = 0;
    __nptr = cdata;
    do {
      dVar2 = atof(__nptr);
      local_2c = (float)dVar2;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (__return_storage_ptr__,__position,&local_2c);
      }
      else {
        *__position._M_current = local_2c;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      do {
        uVar3 = (ulong)((int)uVar3 + 1);
        cVar1 = cdata[uVar3];
        if (cVar1 == '\0') break;
      } while (cVar1 != sep);
      __nptr = cdata + uVar3;
    } while (cVar1 != '\0');
  }
  return __return_storage_ptr__;
}

Assistant:

vector<T> readFromSep(const char * cdata, char sep=' ') {
    vector<T> arr;
    unsigned int begin = 0;
    while (cdata[begin] != '\0') {
        arr.push_back((float)atof(cdata + begin));
        ++begin;
        while (cdata[begin] != '\0' && cdata[begin] != sep) {
            ++begin;
        }
    }
    return arr;
}